

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::PoolingLayerParams::Clear(PoolingLayerParams *this)

{
  (this->kernelsize_).current_size_ = 0;
  (this->stride_).current_size_ = 0;
  this->type_ = 0;
  this->avgpoolexcludepadding_ = false;
  this->globalpooling_ = false;
  clear_PoolingPaddingType(this);
  return;
}

Assistant:

void PoolingLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.PoolingLayerParams)
  kernelsize_.Clear();
  stride_.Clear();
  ::memset(&type_, 0, reinterpret_cast<char*>(&globalpooling_) -
    reinterpret_cast<char*>(&type_) + sizeof(globalpooling_));
  clear_PoolingPaddingType();
}